

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj.c
# Opt level: O3

void Exa_ManExactSynthesis(Bmc_EsPar_t *pPars)

{
  ulong *puVar1;
  bmcg_sat_solver *s;
  Vec_Wrd_t *pVVar2;
  word *pwVar3;
  __time_t _Var4;
  int (*paaiVar5) [2] [32];
  Bmc_EsPar_t *pBVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  Exa_Man_t *p;
  int iVar10;
  long lVar11;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  undefined8 uVar12;
  ulong extraout_RDX_01;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  timespec *ptVar18;
  long lVar19;
  uint uVar20;
  ulong uVar21;
  bool bVar22;
  int iMint;
  timespec ts_1;
  word pTruth [16];
  uint local_14c;
  Vec_Wrd_t *local_148;
  uint local_13c;
  timespec local_138;
  Exa_Man_t *local_120;
  timespec *local_118;
  int local_10c;
  long local_108;
  long local_100;
  int (*local_f8) [2] [32];
  int (*local_f0) [2] [32];
  Bmc_EsPar_t *local_e8;
  long local_e0;
  long local_d8;
  ulong local_d0;
  ulong local_c8;
  undefined1 local_c0 [9];
  undefined7 uStack_b7;
  long local_b0;
  
  local_14c = 1;
  iVar7 = clock_gettime(3,(timespec *)(local_c0 + 8));
  if (iVar7 < 0) {
    local_108 = 1;
  }
  else {
    lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_b0),8);
    local_108 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) + CONCAT71(uStack_b7,local_c0[8]) * -1000000;
  }
  Abc_TtReadHex((word *)(local_c0 + 8),pPars->pTtStr);
  if (10 < pPars->nVars) {
    __assert_fail("pPars->nVars <= 10",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj.c"
                  ,0x327,"void Exa_ManExactSynthesis(Bmc_EsPar_t *)");
  }
  p = Exa_ManAlloc(pPars,(word *)(local_c0 + 8));
  local_10c = 0;
  if ((local_c0[8] & 1) != 0) {
    iVar7 = p->nWords;
    local_10c = 1;
    if (0 < (long)iVar7) {
      lVar11 = 0;
      do {
        *(ulong *)(local_c0 + lVar11 * 8 + 8) = ~*(ulong *)(local_c0 + lVar11 * 8 + 8);
        lVar11 = lVar11 + 1;
      } while (iVar7 != lVar11);
    }
  }
  iVar7 = Exa_ManAddCnfStart(p,pPars->fOnlyAnd);
  if (iVar7 == 0) {
    __assert_fail("status",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj.c"
                  ,0x32b,"void Exa_ManExactSynthesis(Bmc_EsPar_t *)");
  }
  printf("Running exact synthesis for %d-input function with %d two-input gates...\n",
         (ulong)(uint)p->nVars,(ulong)(uint)p->nNodes);
  if (local_14c != 0xffffffff) {
    local_f0 = p->VarMarks;
    local_13c = 0;
    local_120 = p;
    local_e8 = pPars;
    do {
      pBVar6 = local_e8;
      p = local_120;
      iVar7 = clock_gettime(3,&local_138);
      if (iVar7 < 0) {
        lVar11 = 1;
      }
      else {
        lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_138.tv_nsec),8);
        lVar11 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) + local_138.tv_sec * -1000000;
      }
      iVar7 = Exa_ManAddCnf(p,local_14c);
      if (iVar7 == 0) {
LAB_005a54e1:
        if (local_14c != 0xffffffff) goto LAB_005a5500;
        break;
      }
      s = p->pSat;
      iVar7 = bmcg_sat_solver_solve(s,(int *)0x0,0);
      uVar15 = extraout_RDX;
      if (pBVar6->fVerbose != 0) {
        printf("Iter %3d : ",(ulong)local_13c);
        Extra_PrintBinary(_stdout,&local_14c,p->nVars);
        printf("  Var =%5d  ",(ulong)(uint)p->iVar);
        uVar8 = bmcg_sat_solver_clausenum(s);
        printf("Cla =%6d  ",(ulong)uVar8);
        uVar8 = bmcg_sat_solver_conflictnum(s);
        printf("Conf =%9d  ",(ulong)uVar8);
        iVar17 = 3;
        iVar9 = clock_gettime(3,&local_138);
        if (iVar9 < 0) {
          lVar19 = -1;
        }
        else {
          lVar19 = local_138.tv_nsec / 1000 + local_138.tv_sec * 1000000;
        }
        Abc_Print(iVar17,"%s =","Time");
        Abc_Print(iVar17,"%9.2f sec\n",(double)(lVar19 + lVar11) / 1000000.0);
        uVar15 = extraout_RDX_00;
        p = local_120;
      }
      if (iVar7 == 0) {
        printf("The problem timed out after %d sec.\n",(ulong)(uint)pBVar6->RuntimeLim);
        goto LAB_005a54e1;
      }
      if (iVar7 == -1) {
        puts("The problem has no solution.");
        goto LAB_005a54e1;
      }
      iVar7 = p->nVars;
      lVar11 = (long)iVar7;
      uVar8 = p->nObjs;
      if (iVar7 < (int)uVar8) {
        local_f8 = local_f0 + lVar11;
        local_e0 = lVar11;
        do {
          local_c8 = (ulong)(uint)(((int)lVar11 - (int)local_e0) * 3);
          uVar12 = CONCAT71((int7)(uVar15 >> 8),1);
          ptVar18 = &local_138;
          lVar19 = 0;
          local_100 = lVar11;
          do {
            paaiVar5 = local_f8;
            local_148 = (Vec_Wrd_t *)CONCAT44(local_148._4_4_,(int)uVar12);
            local_118 = ptVar18;
            if ((int)uVar8 < 1) {
LAB_005a55b9:
              __assert_fail("Count == 1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj.c"
                            ,0x218,"int Exa_ManFindFanin(Exa_Man_t *, int, int)");
            }
            uVar21 = 0;
            uVar15 = 0xffffffff;
            iVar7 = 0;
            do {
              iVar9 = (*paaiVar5)[lVar19][uVar21];
              if (iVar9 != 0) {
                iVar9 = bmcg_sat_solver_read_cex_varvalue(s,iVar9);
                if (iVar9 != 0) {
                  uVar15 = uVar21 & 0xffffffff;
                }
                iVar7 = iVar7 + (uint)(iVar9 != 0);
              }
              uVar21 = uVar21 + 1;
            } while (uVar21 < uVar8);
            if (iVar7 != 1) goto LAB_005a55b9;
            uVar20 = local_120->nWords;
            uVar21 = (ulong)uVar20;
            uVar13 = (int)uVar15 * uVar20;
            if ((int)uVar13 < 0) goto LAB_005a559a;
            pVVar2 = local_120->vInfo;
            uVar14 = pVVar2->nSize;
            if ((int)uVar14 <= (int)uVar13) goto LAB_005a559a;
            pwVar3 = pVVar2->pArray;
            local_118->tv_sec = (__time_t)(pwVar3 + uVar13);
            lVar19 = 1;
            ptVar18 = (timespec *)local_c0;
            uVar12 = 0;
          } while (((ulong)local_148 & 1) != 0);
          uVar13 = uVar20 * (int)local_100;
          if (((int)uVar13 < 0) || (uVar14 <= uVar13)) goto LAB_005a559a;
          local_148 = pVVar2;
          if (0 < (int)uVar20) {
            memset(pwVar3 + uVar13,0,uVar21 * 8);
          }
          uVar12 = local_c0._0_8_;
          _Var4 = local_138.tv_sec;
          local_118 = (timespec *)(ulong)(uVar20 * uVar8);
          local_d8 = (ulong)uVar13 * 8;
          uVar14 = 1;
          local_d0 = (ulong)uVar13;
          do {
            iVar7 = bmcg_sat_solver_read_cex_varvalue(s,(int)local_c8 + uVar14);
            uVar15 = extraout_RDX_01;
            if (iVar7 != 0) {
              if ((int)local_118 < 0) goto LAB_005a559a;
              uVar13 = local_148->nSize;
              uVar15 = (ulong)uVar13;
              if ((int)uVar13 <= (int)local_118) goto LAB_005a559a;
              pwVar3 = local_148->pArray;
              if ((uVar14 & 1) == 0) {
                if (uVar14 < 2) {
                  if (0 < (int)uVar20) {
                    uVar16 = 0;
                    do {
                      pwVar3[(long)&local_118->tv_sec + uVar16] =
                           ~(*(ulong *)(uVar12 + uVar16 * 8) | *(ulong *)(_Var4 + uVar16 * 8));
                      uVar16 = uVar16 + 1;
                    } while (uVar21 != uVar16);
                  }
                }
                else if (0 < (int)uVar20) {
                  uVar16 = 0;
                  do {
                    pwVar3[(long)&local_118->tv_sec + uVar16] =
                         ~*(ulong *)(_Var4 + uVar16 * 8) & *(ulong *)(uVar12 + uVar16 * 8);
                    uVar16 = uVar16 + 1;
                  } while (uVar21 != uVar16);
                }
              }
              else if (uVar14 < 2) {
                if (0 < (int)uVar20) {
                  uVar16 = 0;
                  do {
                    pwVar3[(long)&local_118->tv_sec + uVar16] =
                         ~*(ulong *)(uVar12 + uVar16 * 8) & *(ulong *)(_Var4 + uVar16 * 8);
                    uVar16 = uVar16 + 1;
                  } while (uVar21 != uVar16);
                }
              }
              else if (0 < (int)uVar20) {
                uVar16 = 0;
                do {
                  pwVar3[(long)&local_118->tv_sec + uVar16] =
                       *(ulong *)(uVar12 + uVar16 * 8) & *(ulong *)(_Var4 + uVar16 * 8);
                  uVar16 = uVar16 + 1;
                } while (uVar21 != uVar16);
              }
              if ((int)uVar13 <= (int)local_d0) goto LAB_005a559a;
              if (0 < (int)uVar20) {
                uVar15 = 0;
                do {
                  puVar1 = (ulong *)((long)pwVar3 + uVar15 * 8 + local_d8);
                  *puVar1 = *puVar1 | pwVar3[(long)&local_118->tv_sec + uVar15];
                  uVar15 = uVar15 + 1;
                } while (uVar21 != uVar15);
              }
            }
            uVar14 = uVar14 + 1;
          } while (uVar14 != 4);
          lVar11 = local_100 + 1;
          local_f8 = local_f8 + 1;
          iVar7 = (int)local_e0;
        } while (lVar11 < (long)(ulong)uVar8);
      }
      else {
        uVar20 = p->nWords;
        local_148 = p->vInfo;
      }
      uVar20 = (uVar8 - 1) * uVar20;
      if (((int)uVar20 < 0) || (local_148->nSize <= (int)uVar20)) {
LAB_005a559a:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                      ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
      }
      uVar8 = 1 << ((byte)iVar7 - 6 & 0x1f);
      if (iVar7 < 7) {
        uVar8 = 1;
      }
      uVar13 = 0xffffffff;
      if (0 < (int)uVar8) {
        iVar9 = 0;
        uVar15 = 0;
        do {
          if (local_148->pArray[uVar20 + uVar15] != local_120->pTruth[uVar15]) {
            uVar21 = local_120->pTruth[uVar15] ^ local_148->pArray[uVar20 + uVar15];
            bVar22 = (int)uVar21 == 0;
            uVar15 = uVar21 >> 0x20;
            if (!bVar22) {
              uVar15 = uVar21;
            }
            iVar10 = (uint)bVar22 * 0x20;
            iVar17 = iVar10 + 0x10;
            uVar21 = uVar15 >> 0x10;
            if ((short)uVar15 != 0) {
              iVar17 = iVar10;
              uVar21 = uVar15;
            }
            iVar10 = iVar17 + 8;
            uVar15 = uVar21 >> 8;
            if ((char)uVar21 != '\0') {
              iVar10 = iVar17;
              uVar15 = uVar21;
            }
            iVar17 = iVar10 + 4;
            uVar21 = uVar15 >> 4;
            if ((uVar15 & 0xf) != 0) {
              iVar17 = iVar10;
              uVar21 = uVar15;
            }
            uVar8 = (uint)(uVar21 >> 2) & 0x3fffffff;
            iVar10 = iVar17 + 2;
            if ((uVar21 & 3) != 0) {
              uVar8 = (uint)uVar21;
              iVar10 = iVar17;
            }
            uVar13 = ((~uVar8 & 1) + iVar10) - iVar9;
            break;
          }
          uVar15 = uVar15 + 1;
          iVar9 = iVar9 + -0x40;
        } while (uVar8 != uVar15);
      }
      if (1 << ((byte)iVar7 & 0x1f) <= (int)uVar13) {
        __assert_fail("iMint < (1 << p->nVars)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj.c"
                      ,0x232,"int Exa_ManEval(Exa_Man_t *)");
      }
      local_13c = local_13c + 1;
      p = local_120;
      local_14c = uVar13;
    } while (uVar13 != 0xffffffff);
  }
  iVar7 = local_10c;
  Exa_ManPrintSolution(p,local_10c);
  Exa_ManDumpBlif(p,iVar7);
LAB_005a5500:
  Exa_ManFree(p);
  iVar9 = 3;
  iVar7 = clock_gettime(3,&local_138);
  if (iVar7 < 0) {
    lVar11 = -1;
  }
  else {
    lVar11 = local_138.tv_nsec / 1000 + local_138.tv_sec * 1000000;
  }
  lVar11 = lVar11 + local_108;
  Abc_Print(iVar9,"%s =","Total runtime");
  Abc_Print(iVar9,"%9.2f sec\n",(double)lVar11 / 1000000.0);
  return;
}

Assistant:

void Exa_ManExactSynthesis( Bmc_EsPar_t * pPars )
{
    int i, status, iMint = 1;
    abctime clkTotal = Abc_Clock();
    Exa_Man_t * p; int fCompl = 0;
    word pTruth[16]; Abc_TtReadHex( pTruth, pPars->pTtStr );
    assert( pPars->nVars <= 10 );
    p = Exa_ManAlloc( pPars, pTruth );
    if ( pTruth[0] & 1 ) { fCompl = 1; Abc_TtNot( pTruth, p->nWords ); }
    status = Exa_ManAddCnfStart( p, pPars->fOnlyAnd );
    assert( status );
    printf( "Running exact synthesis for %d-input function with %d two-input gates...\n", p->nVars, p->nNodes );
    for ( i = 0; iMint != -1; i++ )
    {
        abctime clk = Abc_Clock();
        if ( !Exa_ManAddCnf( p, iMint ) )
            break;
        status = bmcg_sat_solver_solve( p->pSat, NULL, 0 );
        if ( pPars->fVerbose )
        {
            printf( "Iter %3d : ", i );
            Extra_PrintBinary( stdout, (unsigned *)&iMint, p->nVars );
            printf( "  Var =%5d  ", p->iVar );
            printf( "Cla =%6d  ", bmcg_sat_solver_clausenum(p->pSat) );
            printf( "Conf =%9d  ", bmcg_sat_solver_conflictnum(p->pSat) );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        }
        if ( status == GLUCOSE_UNSAT )
        {
            printf( "The problem has no solution.\n" );
            break;
        }
        if ( status == GLUCOSE_UNDEC )
        {
            printf( "The problem timed out after %d sec.\n", pPars->RuntimeLim );
            break;
        }
        iMint = Exa_ManEval( p );
    }
    if ( iMint == -1 )
    {
        Exa_ManPrintSolution( p, fCompl );
        Exa_ManDumpBlif( p, fCompl );
    }
    Exa_ManFree( p );
    Abc_PrintTime( 1, "Total runtime", Abc_Clock() - clkTotal );
}